

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

void hit_chance(random_chance *chance,wchar_t to_hit,wchar_t ac)

{
  wchar_t wVar1;
  int iVar2;
  
  wVar1 = L'\t';
  if (L'\t' < to_hit) {
    wVar1 = to_hit;
  }
  iVar2 = (int)((ulong)((long)(ac * 2) * 0x55555555) >> 0x20) + ac * -2;
  iVar2 = ((iVar2 >> 1) - (iVar2 >> 0x1f)) + wVar1;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  chance->denominator = 10000;
  chance->numerator = (((uint)(iVar2 * 10000) / (uint)wVar1) * 0x206c) / 10000 + 0x4b0;
  return;
}

Assistant:

void hit_chance(random_chance *chance, int to_hit, int ac)
{
	/* Percentages scaled to 10,000 to avoid rounding error */
	const int HUNDRED_PCT = 10000;
	const int ALWAYS_HIT = 1200;
	const int ALWAYS_MISS = 500;

	/* Put a floor on the to_hit */
	to_hit = MAX(9, to_hit);

	/* Calculate the hit percentage */
	chance->numerator = MAX(0, to_hit - ac * 2 / 3);
	chance->denominator = to_hit;

	/* Convert the ratio to a scaled percentage */
	chance->numerator = HUNDRED_PCT * chance->numerator / chance->denominator;
	chance->denominator = HUNDRED_PCT;

	/* The calculated rate only applies when the guaranteed hit/miss don't */
	chance->numerator = chance->numerator *
			(HUNDRED_PCT - ALWAYS_MISS - ALWAYS_HIT) / HUNDRED_PCT;

	/* Add in the guaranteed hit */
	chance->numerator += ALWAYS_HIT;
}